

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O0

void __thiscall
ST::string::_set_utf8(string *this,char *utf8,size_t size,utf_validation_t validation)

{
  buffer<char> local_68;
  buffer<char> local_48;
  utf_validation_t local_24;
  size_t sStack_20;
  utf_validation_t validation_local;
  size_t size_local;
  char *utf8_local;
  string *this_local;
  
  local_24 = validation;
  sStack_20 = size;
  size_local = (size_t)utf8;
  utf8_local = (char *)this;
  if (0xfffffff < size) {
    _ST_PRIVATE::assert_handler
              ("/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/include/st_string.h"
               ,0x5e,"String data buffer is too large");
  }
  if (size_local == 0) {
    buffer<char>::buffer(&local_48);
    buffer<char>::operator=(&this->m_buffer,&local_48);
    buffer<char>::~buffer(&local_48);
  }
  else {
    buffer<char>::buffer(&local_68,(char *)size_local,sStack_20);
    set(this,&local_68,local_24);
    buffer<char>::~buffer(&local_68);
  }
  return;
}

Assistant:

void _set_utf8(const char *utf8, size_t size, utf_validation_t validation)
        {
            ST_ASSERT(size < ST_HUGE_BUFFER_SIZE, "String data buffer is too large");

            if (!utf8) {
                m_buffer = char_buffer();
                return;
            }

            set(char_buffer(utf8, size), validation);
        }